

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void unixModeBit(unixFile *pFile,uchar mask,int *pArg)

{
  if (*pArg < 0) {
    *pArg = (uint)((pFile->ctrlFlags & (ushort)mask) != 0);
    return;
  }
  if (*pArg != 0) {
    pFile->ctrlFlags = pFile->ctrlFlags | (ushort)mask;
    return;
  }
  pFile->ctrlFlags = pFile->ctrlFlags & (short)(char)~mask;
  return;
}

Assistant:

static void unixModeBit(unixFile *pFile, unsigned char mask, int *pArg){
  if( *pArg<0 ){
    *pArg = (pFile->ctrlFlags & mask)!=0;
  }else if( (*pArg)==0 ){
    pFile->ctrlFlags &= ~mask;
  }else{
    pFile->ctrlFlags |= mask;
  }
}